

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

void __thiscall
HighsLinearSumBounds::shrink
          (HighsLinearSumBounds *this,vector<int,_std::allocator<int>_> *newIndices,HighsInt newSize
          )

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  HighsInt i;
  HighsInt oldNumInds;
  reference in_stack_ffffffffffffff78;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffff80;
  int local_1c;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  for (local_1c = 0; local_1c != (int)sVar2; local_1c = local_1c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
    if (*pvVar3 != -1) {
      pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI + 4,(long)local_1c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI + 4,(long)*pvVar3);
      pvVar5->hi = pvVar4->hi;
      pvVar5->lo = pvVar4->lo;
      in_stack_ffffffffffffff78 =
           std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                     (in_RDI + 5,(long)local_1c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI + 5,(long)*pvVar3);
      pvVar4->hi = in_stack_ffffffffffffff78->hi;
      pvVar4->lo = in_stack_ffffffffffffff78->lo;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_1c);
      vVar1 = *pvVar6;
      in_stack_ffffffffffffff80 = in_RDI + 6;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                          (long)*pvVar3);
      *pvVar6 = vVar1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)local_1c);
      vVar1 = *pvVar6;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)*pvVar3);
      *pvVar6 = vVar1;
      pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI,(long)local_1c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI,(long)*pvVar3);
      pvVar5->hi = pvVar4->hi;
      pvVar5->lo = pvVar4->lo;
      pvVar4 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI + 1,(long)local_1c);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         (in_RDI + 1,(long)*pvVar3);
      pvVar5->hi = pvVar4->hi;
      pvVar5->lo = pvVar4->lo;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_1c);
      vVar1 = *pvVar6;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)*pvVar3);
      *pvVar6 = vVar1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_1c);
      vVar1 = *pvVar6;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)*pvVar3);
      *pvVar6 = vVar1;
    }
  }
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             (size_type)in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             (size_type)in_stack_ffffffffffffff78);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             (size_type)in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             (size_type)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void HighsLinearSumBounds::shrink(const std::vector<HighsInt>& newIndices,
                                  HighsInt newSize) {
  HighsInt oldNumInds = newIndices.size();
  for (HighsInt i = 0; i != oldNumInds; ++i) {
    if (newIndices[i] != -1) {
      sumLower[newIndices[i]] = sumLower[i];
      sumUpper[newIndices[i]] = sumUpper[i];
      numInfSumLower[newIndices[i]] = numInfSumLower[i];
      numInfSumUpper[newIndices[i]] = numInfSumUpper[i];
      sumLowerOrig[newIndices[i]] = sumLowerOrig[i];
      sumUpperOrig[newIndices[i]] = sumUpperOrig[i];
      numInfSumLowerOrig[newIndices[i]] = numInfSumLowerOrig[i];
      numInfSumUpperOrig[newIndices[i]] = numInfSumUpperOrig[i];
    }
  }

  sumLower.resize(newSize);
  sumUpper.resize(newSize);
  numInfSumLower.resize(newSize);
  numInfSumUpper.resize(newSize);
  sumLowerOrig.resize(newSize);
  sumUpperOrig.resize(newSize);
  numInfSumLowerOrig.resize(newSize);
  numInfSumUpperOrig.resize(newSize);
}